

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarTextNavigator::removeDateLabel(QCalendarTextNavigator *this)

{
  pointer pSVar1;
  QCalendarDateValidator *in_RDI;
  
  if ((in_RDI->m_tokens).
      super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    QBasicTimer::stop();
    QWidget::hide((QWidget *)0x5180dc);
    QObject::deleteLater();
    pSVar1 = (in_RDI->m_tokens).
             super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pSVar1 != (pointer)0x0) {
      QCalendarDateValidator::~QCalendarDateValidator(in_RDI);
      operator_delete(pSVar1,0xb0);
    }
    (in_RDI->m_tokens).
    super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->m_separators).d.size = 0;
    (in_RDI->m_tokens).
    super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return;
}

Assistant:

void QCalendarTextNavigator::removeDateLabel()
{
    if (!m_dateFrame)
        return;
    m_acceptTimer.stop();
    m_dateFrame->hide();
    m_dateFrame->deleteLater();
    delete m_dateValidator;
    m_dateFrame = nullptr;
    m_dateText = nullptr;
    m_dateValidator = nullptr;
}